

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReproduceListener.cpp
# Opt level: O1

void __thiscall rc::detail::ReproduceListener::~ReproduceListener(ReproduceListener *this)

{
  ostream *poVar1;
  string local_30;
  
  (this->super_TestListenerAdapter).super_TestListener._vptr_TestListener =
       (_func_int **)&PTR_onTestCaseFinished_001b54a0;
  if ((this->m_reproduceMap)._M_h._M_element_count != 0) {
    poVar1 = this->m_out;
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,"Some of your RapidCheck properties had failures. To ",0x34);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"reproduce these, run with:",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    poVar1 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"RC_PARAMS=\"reproduce=",0x15);
    reproduceMapToString(&local_30,&this->m_reproduceMap);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar1,local_30._M_dataplus._M_p,local_30._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\"",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p);
    }
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rc::detail::Reproduce>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rc::detail::Reproduce>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&(this->m_reproduceMap)._M_h);
  return;
}

Assistant:

ReproduceListener::~ReproduceListener() {
  if (m_reproduceMap.empty()) {
    return;
  }

  m_out << "Some of your RapidCheck properties had failures. To "
        << "reproduce these, run with:" << std::endl
        << "RC_PARAMS=\"reproduce=" << reproduceMapToString(m_reproduceMap)
        << "\"" << std::endl;
}